

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O0

FIOBJ fiobj_hash_new2(size_t capa)

{
  void *__dest;
  int *piVar1;
  undefined1 local_50 [4];
  undefined4 local_4c;
  void *local_18;
  fiobj_hash_s *h;
  size_t capa_local;
  
  h = (fiobj_hash_s *)capa;
  __dest = fio_malloc(0x38);
  local_18 = __dest;
  if (__dest == (void *)0x0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c:177"
                    );
    }
    kill(0,2);
    piVar1 = __errno_location();
    exit(*piVar1);
  }
  memset(local_50,0,0x38);
  local_50[0] = 0x2a;
  local_4c = 1;
  memcpy(__dest,local_50,0x38);
  fio_hash___capa_require((fio_hash___s *)((long)local_18 + 8),(size_t)h);
  return (ulong)local_18 | 4;
}

Assistant:

FIOBJ fiobj_hash_new2(size_t capa) {
  fiobj_hash_s *h = fio_malloc(sizeof(*h));
  FIO_ASSERT_ALLOC(h);
  *h = (fiobj_hash_s){.head = {.ref = 1, .type = FIOBJ_T_HASH},
                      .hash = FIO_SET_INIT};
  fio_hash___capa_require(&h->hash, capa);
  return (FIOBJ)h | FIOBJECT_HASH_FLAG;
}